

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::TabItemEx(ImGuiTabBar *tab_bar,char *label,bool *p_open,ImGuiTabItemFlags flags)

{
  ImVec2 *pIVar1;
  float fVar2;
  short sVar3;
  uint uVar4;
  ImGuiWindow *pIVar5;
  ImDrawList *draw_list;
  ImVec2 IVar6;
  undefined1 auVar7 [16];
  byte bVar8;
  ImGuiContext *pIVar9;
  char *pcVar10;
  bool *pbVar11;
  bool bVar12;
  bool bVar13;
  ImU32 IVar14;
  uint uVar15;
  int iVar16;
  int iVar17;
  ImU32 col;
  ImGuiID close_button_id;
  ImGuiTabItem *pIVar18;
  size_t sVar19;
  undefined8 extraout_RAX;
  char *pcVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  ImGuiCol idx;
  long lVar24;
  ImGuiTabItem *pIVar25;
  undefined1 uVar26;
  uint uVar27;
  undefined7 uVar29;
  undefined8 uVar28;
  undefined1 auVar30 [4];
  float fVar31;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  ImVec2 IVar32;
  bool text_clipped;
  bool just_closed;
  uint local_bc;
  ImGuiContext *local_b8;
  ImGuiTextBuffer *local_b0;
  ImRect bb;
  bool hovered;
  undefined7 uStack_77;
  float fStack_74;
  bool held;
  float local_6c;
  undefined1 local_68 [4];
  undefined1 auStack_64 [12];
  uint local_50;
  int local_4c;
  int local_48;
  ImU32 local_44;
  char *local_40;
  bool *local_38;
  
  if (tab_bar->WantLayout == true) {
    TabBarLayout(tab_bar);
  }
  pIVar9 = GImGui;
  pIVar5 = GImGui->CurrentWindow;
  if (pIVar5->SkipItems != false) {
    return false;
  }
  IVar14 = TabBarCalcTabID((ImGuiTabBar *)(ulong)(uint)tab_bar->Flags,label);
  if (p_open != (bool *)0x0) {
    if (*p_open == false) {
      PushItemFlag(0x18,true);
      bb.Min.x = 0.0;
      bb.Min.y = 0.0;
      bb.Max.x = 0.0;
      bb.Max.y = 0.0;
      ItemAdd(&bb,IVar14,(ImRect *)0x0,0);
      PopItemFlag();
      return false;
    }
    if (((uint)flags >> 0x15 & 1) != 0) {
      __assert_fail("!p_open || !(flags & ImGuiTabItemFlags_Button)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_widgets.cpp"
                    ,0x1e3d,
                    "bool ImGui::TabItemEx(ImGuiTabBar *, const char *, bool *, ImGuiTabItemFlags)")
      ;
    }
  }
  local_b8 = pIVar9;
  if ((~flags & 0xc0U) == 0) {
    __assert_fail("(flags & (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)) != (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_widgets.cpp"
                  ,0x1e3e,
                  "bool ImGui::TabItemEx(ImGuiTabBar *, const char *, bool *, ImGuiTabItemFlags)");
  }
  local_38 = (bool *)0x0;
  uVar27 = flags;
  if (((uint)flags >> 0x14 & 1) == 0) {
    local_38 = p_open;
    uVar27 = flags | 0x100000;
  }
  if (p_open != (bool *)0x0) {
    uVar27 = flags;
  }
  IVar6 = TabItemCalcSize(label,local_38 != (bool *)0x0);
  auVar30 = (undefined1  [4])IVar6.x;
  uVar15 = (tab_bar->Tabs).Size;
  unique0x100001a0 = extraout_XMM0_Dc;
  local_68 = (undefined1  [4])IVar6.x;
  auStack_64._0_4_ = IVar6.y;
  unique0x100001a4 = extraout_XMM0_Dd;
  local_40 = label;
  if (0 < (int)uVar15 && IVar14 != 0) {
    pIVar18 = (tab_bar->Tabs).Data;
    lVar24 = 0;
    do {
      if (*(ImU32 *)((long)&pIVar18->ID + lVar24) == IVar14) {
        pIVar25 = (ImGuiTabItem *)((long)&pIVar18->ID + lVar24);
        bVar8 = 0;
        goto LAB_0017ff82;
      }
      lVar24 = lVar24 + 0x28;
    } while ((ulong)uVar15 * 0x28 != lVar24);
  }
  if (uVar15 == (tab_bar->Tabs).Capacity) {
    if (uVar15 == 0) {
      iVar21 = 8;
    }
    else {
      iVar21 = (int)uVar15 / 2 + uVar15;
    }
    iVar23 = uVar15 + 1;
    if ((int)(uVar15 + 1) < iVar21) {
      iVar23 = iVar21;
    }
    pIVar18 = (ImGuiTabItem *)MemAlloc((long)iVar23 * 0x28);
    pIVar25 = (tab_bar->Tabs).Data;
    if (pIVar25 != (ImGuiTabItem *)0x0) {
      memcpy(pIVar18,pIVar25,(long)(tab_bar->Tabs).Size * 0x28);
      MemFree((tab_bar->Tabs).Data);
    }
    (tab_bar->Tabs).Data = pIVar18;
    (tab_bar->Tabs).Capacity = iVar23;
    uVar15 = (tab_bar->Tabs).Size;
    auVar30 = local_68;
  }
  else {
    pIVar18 = (tab_bar->Tabs).Data;
  }
  pIVar18[(int)uVar15].ID = 0;
  pIVar18[(int)uVar15].Flags = 0;
  pIVar18[(int)uVar15].LastFrameVisible = -1;
  pIVar18[(int)uVar15].LastFrameSelected = -1;
  pIVar18[(int)uVar15].Offset = 0.0;
  pIVar18[(int)uVar15].Width = 0.0;
  pIVar18[(int)uVar15].ContentWidth = 0.0;
  pIVar25 = pIVar18 + (int)uVar15;
  pIVar25->NameOffset = -1;
  pIVar25->BeginOrder = -1;
  pIVar25->IndexDuringLayout = -1;
  *(undefined4 *)&pIVar18[(int)uVar15].WantClose = 0;
  iVar21 = (tab_bar->Tabs).Size;
  uVar15 = iVar21 + 1;
  (tab_bar->Tabs).Size = uVar15;
  if (iVar21 < 0) {
    __assert_fail("Size > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.h"
                  ,0x695,"T &ImVector<ImGuiTabItem>::back() [T = ImGuiTabItem]");
  }
  pIVar18 = (tab_bar->Tabs).Data;
  pIVar25 = pIVar18 + ((ulong)uVar15 - 1);
  pIVar25->ID = IVar14;
  pIVar18[(ulong)uVar15 - 1].Width = (float)auVar30;
  tab_bar->TabsAddedNew = true;
  bVar8 = 1;
LAB_0017ff82:
  pcVar10 = local_40;
  local_44 = IVar14;
  if ((pIVar25 < pIVar18) || (pIVar18 + (int)uVar15 <= pIVar25)) {
    __assert_fail("it >= Data && it < Data + Size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.h"
                  ,0x6ac,
                  "int ImVector<ImGuiTabItem>::index_from_ptr(const T *) const [T = ImGuiTabItem]");
  }
  tab_bar->LastTabItemIdx = (short)((uint)((int)pIVar25 - (int)pIVar18) >> 3) * -0x3333;
  pIVar25->ContentWidth = (float)auVar30;
  sVar3 = tab_bar->TabsActiveCount;
  tab_bar->TabsActiveCount = sVar3 + 1;
  pIVar25->BeginOrder = sVar3;
  uVar15 = tab_bar->Flags;
  iVar16 = tab_bar->PrevFrameVisible + 1;
  iVar21 = local_b8->FrameCount;
  iVar22 = pIVar25->LastFrameVisible + 1;
  pIVar25->LastFrameVisible = iVar21;
  pIVar25->Flags = uVar27;
  local_b0 = &tab_bar->TabsNames;
  iVar23 = (tab_bar->TabsNames).Buf.Size;
  iVar17 = iVar23 + -1;
  if (iVar23 == 0) {
    iVar17 = 0;
  }
  pIVar25->NameOffset = iVar17;
  sVar19 = strlen(local_40);
  ImGuiTextBuffer::append(local_b0,pcVar10,pcVar10 + sVar19 + 1);
  IVar14 = local_44;
  if (((iVar22 < iVar21) && ((tab_bar->Flags & 2) != 0)) && (tab_bar->NextSelectedTabId == 0)) {
    if (iVar16 < iVar21) {
      if ((uVar27 & 0x200000) == 0 && tab_bar->SelectedTabId == 0) goto LAB_00180084;
    }
    else if ((uVar27 >> 0x15 & 1) == 0) {
LAB_00180084:
      tab_bar->NextSelectedTabId = local_44;
    }
  }
  if ((((uVar27 & 2) != 0) && (tab_bar->SelectedTabId != local_44)) && ((uVar27 & 0x200000) == 0)) {
    tab_bar->NextSelectedTabId = local_44;
  }
  uVar29 = (undefined7)((ulong)tab_bar >> 8);
  if (tab_bar->VisibleTabId == local_44) {
    tab_bar->VisibleTabWasSubmitted = true;
    uVar28 = CONCAT71(uVar29,1);
  }
  else if ((tab_bar->SelectedTabId == 0 && iVar16 < iVar21) && ((tab_bar->Tabs).Size == 1)) {
    uVar28 = CONCAT71(uVar29,(tab_bar->Flags & 2) == 0);
  }
  else {
    uVar28 = 0;
  }
  if ((bool)((bVar8 | iVar21 <= iVar16) & iVar22 < iVar21)) {
    PushItemFlag(0x18,true);
    bb.Min.x = 0.0;
    bb.Min.y = 0.0;
    bb.Max.x = 0.0;
    bb.Max.y = 0.0;
    ItemAdd(&bb,IVar14,(ImRect *)0x0,0);
    PopItemFlag();
    return (bool)((uVar27 >> 0x15 & 1) == 0 & (byte)uVar28);
  }
  if (tab_bar->SelectedTabId == local_44) {
    pIVar25->LastFrameSelected = local_b8->FrameCount;
  }
  uVar4 = pIVar25->Flags;
  fVar2 = pIVar25->Width;
  fVar31 = pIVar25->Offset;
  if ((uVar4 & 0xc0) == 0) {
    fVar31 = (float)(int)(fVar31 - tab_bar->ScrollingAnim);
  }
  bb.Min.x = fVar31 + (tab_bar->BarRect).Min.x;
  IVar6 = (pIVar5->DC).CursorPos;
  bb.Min.y = (tab_bar->BarRect).Min.y + 0.0;
  IVar32.y = bb.Min.y;
  IVar32.x = bb.Min.x;
  (pIVar5->DC).CursorPos = IVar32;
  bb.Max.x = fVar2 + bb.Min.x;
  bb.Max.y = (float)auStack_64._0_4_ + bb.Min.y;
  local_bc = uVar27;
  local_b0 = (ImGuiTextBuffer *)uVar28;
  local_4c = iVar22;
  local_48 = iVar21;
  if ((uVar4 & 0xc0) == 0) {
    fVar2 = tab_bar->ScrollingRectMinX;
    if ((fVar2 <= bb.Min.x) && (bb.Max.x <= tab_bar->ScrollingRectMaxX)) goto LAB_001801e0;
    fStack_74 = bb.Min.y + -1.0;
    _hovered = (float)(~-(uint)(fVar2 <= bb.Min.x) & (uint)fVar2 |
                      (uint)bb.Min.x & -(uint)(fVar2 <= bb.Min.x));
    _held = tab_bar->ScrollingRectMaxX;
    local_6c = bb.Max.y;
    PushClipRect((ImVec2 *)&hovered,(ImVec2 *)&held,true);
    local_68 = (undefined1  [4])(int)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
  }
  else {
LAB_001801e0:
    auVar7._12_4_ = 0;
    auVar7._0_12_ = auStack_64;
    _local_68 = auVar7 << 0x20;
  }
  pIVar9 = local_b8;
  _hovered = bb.Max.x - bb.Min.x;
  fStack_74 = bb.Max.y - bb.Min.y;
  IVar32 = (pIVar5->DC).CursorMaxPos;
  ItemSize((ImVec2 *)&hovered,(local_b8->Style).FramePadding.y);
  (pIVar5->DC).CursorMaxPos = IVar32;
  bVar12 = ItemAdd(&bb,IVar14,(ImRect *)0x0,0);
  if (!bVar12) {
    uVar26 = SUB81(local_b0,0);
    if (local_68[0] != '\0') {
      PopClipRect();
    }
    (pIVar5->DC).CursorPos = IVar6;
    return (bool)uVar26;
  }
  uVar27 = local_bc & 0x200000;
  bVar12 = ButtonBehavior(&bb,IVar14,&hovered,&held,
                          (uVar27 >> 0x11) + (uint)pIVar9->DragDropActive * 0x200 + 0x1010);
  pbVar11 = local_38;
  pcVar10 = local_40;
  if ((bVar12) && (uVar27 == 0)) {
    tab_bar->NextSelectedTabId = IVar14;
  }
  hovered = (bool)(hovered | local_b8->HoveredId == IVar14);
  if (local_b8->ActiveId != IVar14) {
    SetItemAllowOverlap();
  }
  if (((((held == true) && (local_48 <= local_4c)) && (bVar13 = IsMouseDragging(0,-1.0), bVar13)) &&
      ((local_b8->DragDropActive == false && ((tab_bar->Flags & 1) != 0)))) &&
     (((fVar2 = (local_b8->IO).MouseDelta.x, fVar2 < 0.0 &&
       (pIVar1 = &(local_b8->IO).MousePos, pIVar1->x <= bb.Min.x && bb.Min.x != pIVar1->x)) ||
      ((0.0 < fVar2 && (bb.Max.x < (local_b8->IO).MousePos.x)))))) {
    TabBarQueueReorderFromMousePos(tab_bar,pIVar25,(local_b8->IO).MousePos);
  }
  draw_list = pIVar5->DrawList;
  idx = 0x22;
  if ((held == false) && (hovered == false)) {
    if ((char)local_b0 == '\0') {
      idx = (uint)((uVar15 >> 0x15 & 1) == 0) * 3 + 0x21;
    }
    else {
      idx = (uint)((uVar15 >> 0x15 & 1) == 0) * 2 + 0x23;
    }
  }
  local_50 = uVar27;
  col = GetColorU32(idx,1.0);
  TabItemBackground(draw_list,&bb,local_bc,col);
  RenderNavHighlight(&bb,IVar14,1);
  bVar13 = IsItemHovered(8);
  if (bVar13) {
    bVar13 = IsMouseClicked(1,false);
    if (bVar13) {
      uVar27 = local_bc >> 0x15 & 1;
    }
    else {
      bVar13 = IsMouseReleased(1);
      uVar27 = local_50;
      if (!bVar13) goto LAB_001804a0;
    }
    if (uVar27 == 0) {
      tab_bar->NextSelectedTabId = IVar14;
    }
  }
LAB_001804a0:
  uVar27 = (uint)tab_bar->Flags >> 1 & 4 | local_bc;
  if (pbVar11 == (bool *)0x0) {
    close_button_id = 0;
  }
  else {
    close_button_id = GetIDWithSeed("#CLOSE",(char *)0x0,IVar14);
  }
  TabItemLabelAndCloseButton
            (draw_list,&bb,uVar27,tab_bar->FramePadding,pcVar10,IVar14,close_button_id,
             SUB81(local_b0,0),&just_closed,&text_clipped);
  if ((pbVar11 != (bool *)0x0) && (just_closed != false)) {
    *pbVar11 = false;
    TabBarCloseTab(tab_bar,pIVar25);
  }
  if (local_68[0] != '\0') {
    PopClipRect();
  }
  uVar27 = local_bc;
  (pIVar5->DC).CursorPos = IVar6;
  uVar26 = SUB81(local_b0,0);
  if ((((text_clipped == true) && (local_b8->HoveredId == IVar14)) && (held == false)) &&
     (((local_b8->TooltipSlowDelay <= local_b8->HoveredIdNotActiveTimer &&
        local_b8->HoveredIdNotActiveTimer != local_b8->TooltipSlowDelay &&
       (bVar13 = IsItemHovered(0), bVar13)) &&
      (((tab_bar->Flags & 0x20) == 0 && ((pIVar25->Flags & 0x10) == 0)))))) {
    pcVar20 = FindRenderedTextEnd(pcVar10,(char *)0x0);
    SetTooltip("%.*s",(ulong)(uint)((int)pcVar20 - (int)pcVar10),pcVar10);
  }
  if (((uVar27 >> 0x15 & 1) != 0) && (uVar26 = bVar12, tab_bar->SelectedTabId == pIVar25->ID)) {
    __assert_fail("!is_tab_button || !(tab_bar->SelectedTabId == tab->ID && is_tab_button)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_widgets.cpp"
                  ,0x1ef3,
                  "bool ImGui::TabItemEx(ImGuiTabBar *, const char *, bool *, ImGuiTabItemFlags)");
  }
  return (bool)uVar26;
}

Assistant:

bool    ImGui::TabItemEx(ImGuiTabBar* tab_bar, const char* label, bool* p_open, ImGuiTabItemFlags flags)
{
    // Layout whole tab bar if not already done
    if (tab_bar->WantLayout)
        TabBarLayout(tab_bar);

    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return false;

    const ImGuiStyle& style = g.Style;
    const ImGuiID id = TabBarCalcTabID(tab_bar, label);

    // If the user called us with *p_open == false, we early out and don't render.
    // We make a call to ItemAdd() so that attempts to use a contextual popup menu with an implicit ID won't use an older ID.
    IMGUI_TEST_ENGINE_ITEM_INFO(id, label, window->DC.LastItemStatusFlags);
    if (p_open && !*p_open)
    {
        PushItemFlag(ImGuiItemFlags_NoNav | ImGuiItemFlags_NoNavDefaultFocus, true);
        ItemAdd(ImRect(), id);
        PopItemFlag();
        return false;
    }

    IM_ASSERT(!p_open || !(flags & ImGuiTabItemFlags_Button));
    IM_ASSERT((flags & (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)) != (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)); // Can't use both Leading and Trailing

    // Store into ImGuiTabItemFlags_NoCloseButton, also honor ImGuiTabItemFlags_NoCloseButton passed by user (although not documented)
    if (flags & ImGuiTabItemFlags_NoCloseButton)
        p_open = NULL;
    else if (p_open == NULL)
        flags |= ImGuiTabItemFlags_NoCloseButton;

    // Calculate tab contents size
    ImVec2 size = TabItemCalcSize(label, p_open != NULL);

    // Acquire tab data
    ImGuiTabItem* tab = TabBarFindTabByID(tab_bar, id);
    bool tab_is_new = false;
    if (tab == NULL)
    {
        tab_bar->Tabs.push_back(ImGuiTabItem());
        tab = &tab_bar->Tabs.back();
        tab->ID = id;
        tab->Width = size.x;
        tab_bar->TabsAddedNew = true;
        tab_is_new = true;
    }
    tab_bar->LastTabItemIdx = (ImS16)tab_bar->Tabs.index_from_ptr(tab);
    tab->ContentWidth = size.x;
    tab->BeginOrder = tab_bar->TabsActiveCount++;

    const bool tab_bar_appearing = (tab_bar->PrevFrameVisible + 1 < g.FrameCount);
    const bool tab_bar_focused = (tab_bar->Flags & ImGuiTabBarFlags_IsFocused) != 0;
    const bool tab_appearing = (tab->LastFrameVisible + 1 < g.FrameCount);
    const bool is_tab_button = (flags & ImGuiTabItemFlags_Button) != 0;
    tab->LastFrameVisible = g.FrameCount;
    tab->Flags = flags;

    // Append name with zero-terminator
    tab->NameOffset = (ImS32)tab_bar->TabsNames.size();
    tab_bar->TabsNames.append(label, label + strlen(label) + 1);

    // Update selected tab
    if (tab_appearing && (tab_bar->Flags & ImGuiTabBarFlags_AutoSelectNewTabs) && tab_bar->NextSelectedTabId == 0)
        if (!tab_bar_appearing || tab_bar->SelectedTabId == 0)
            if (!is_tab_button)
                tab_bar->NextSelectedTabId = id;  // New tabs gets activated
    if ((flags & ImGuiTabItemFlags_SetSelected) && (tab_bar->SelectedTabId != id)) // SetSelected can only be passed on explicit tab bar
        if (!is_tab_button)
            tab_bar->NextSelectedTabId = id;

    // Lock visibility
    // (Note: tab_contents_visible != tab_selected... because CTRL+TAB operations may preview some tabs without selecting them!)
    bool tab_contents_visible = (tab_bar->VisibleTabId == id);
    if (tab_contents_visible)
        tab_bar->VisibleTabWasSubmitted = true;

    // On the very first frame of a tab bar we let first tab contents be visible to minimize appearing glitches
    if (!tab_contents_visible && tab_bar->SelectedTabId == 0 && tab_bar_appearing)
        if (tab_bar->Tabs.Size == 1 && !(tab_bar->Flags & ImGuiTabBarFlags_AutoSelectNewTabs))
            tab_contents_visible = true;

    // Note that tab_is_new is not necessarily the same as tab_appearing! When a tab bar stops being submitted
    // and then gets submitted again, the tabs will have 'tab_appearing=true' but 'tab_is_new=false'.
    if (tab_appearing && (!tab_bar_appearing || tab_is_new))
    {
        PushItemFlag(ImGuiItemFlags_NoNav | ImGuiItemFlags_NoNavDefaultFocus, true);
        ItemAdd(ImRect(), id);
        PopItemFlag();
        if (is_tab_button)
            return false;
        return tab_contents_visible;
    }

    if (tab_bar->SelectedTabId == id)
        tab->LastFrameSelected = g.FrameCount;

    // Backup current layout position
    const ImVec2 backup_main_cursor_pos = window->DC.CursorPos;

    // Layout
    const bool is_central_section = (tab->Flags & ImGuiTabItemFlags_SectionMask_) == 0;
    size.x = tab->Width;
    if (is_central_section)
        window->DC.CursorPos = tab_bar->BarRect.Min + ImVec2(IM_FLOOR(tab->Offset - tab_bar->ScrollingAnim), 0.0f);
    else
        window->DC.CursorPos = tab_bar->BarRect.Min + ImVec2(tab->Offset, 0.0f);
    ImVec2 pos = window->DC.CursorPos;
    ImRect bb(pos, pos + size);

    // We don't have CPU clipping primitives to clip the CloseButton (until it becomes a texture), so need to add an extra draw call (temporary in the case of vertical animation)
    const bool want_clip_rect = is_central_section && (bb.Min.x < tab_bar->ScrollingRectMinX || bb.Max.x > tab_bar->ScrollingRectMaxX);
    if (want_clip_rect)
        PushClipRect(ImVec2(ImMax(bb.Min.x, tab_bar->ScrollingRectMinX), bb.Min.y - 1), ImVec2(tab_bar->ScrollingRectMaxX, bb.Max.y), true);

    ImVec2 backup_cursor_max_pos = window->DC.CursorMaxPos;
    ItemSize(bb.GetSize(), style.FramePadding.y);
    window->DC.CursorMaxPos = backup_cursor_max_pos;

    if (!ItemAdd(bb, id))
    {
        if (want_clip_rect)
            PopClipRect();
        window->DC.CursorPos = backup_main_cursor_pos;
        return tab_contents_visible;
    }

    // Click to Select a tab
    ImGuiButtonFlags button_flags = ((is_tab_button ? ImGuiButtonFlags_PressedOnClickRelease : ImGuiButtonFlags_PressedOnClick) | ImGuiButtonFlags_AllowItemOverlap);
    if (g.DragDropActive)
        button_flags |= ImGuiButtonFlags_PressedOnDragDropHold;
    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held, button_flags);
    if (pressed && !is_tab_button)
        tab_bar->NextSelectedTabId = id;
    hovered |= (g.HoveredId == id);

    // Allow the close button to overlap unless we are dragging (in which case we don't want any overlapping tabs to be hovered)
    if (g.ActiveId != id)
        SetItemAllowOverlap();

    // Drag and drop: re-order tabs
    if (held && !tab_appearing && IsMouseDragging(0))
    {
        if (!g.DragDropActive && (tab_bar->Flags & ImGuiTabBarFlags_Reorderable))
        {
            // While moving a tab it will jump on the other side of the mouse, so we also test for MouseDelta.x
            if (g.IO.MouseDelta.x < 0.0f && g.IO.MousePos.x < bb.Min.x)
            {
                TabBarQueueReorderFromMousePos(tab_bar, tab, g.IO.MousePos);
            }
            else if (g.IO.MouseDelta.x > 0.0f && g.IO.MousePos.x > bb.Max.x)
            {
                TabBarQueueReorderFromMousePos(tab_bar, tab, g.IO.MousePos);
            }
        }
    }

#if 0
    if (hovered && g.HoveredIdNotActiveTimer > TOOLTIP_DELAY && bb.GetWidth() < tab->ContentWidth)
    {
        // Enlarge tab display when hovering
        bb.Max.x = bb.Min.x + IM_FLOOR(ImLerp(bb.GetWidth(), tab->ContentWidth, ImSaturate((g.HoveredIdNotActiveTimer - 0.40f) * 6.0f)));
        display_draw_list = GetForegroundDrawList(window);
        TabItemBackground(display_draw_list, bb, flags, GetColorU32(ImGuiCol_TitleBgActive));
    }
#endif

    // Render tab shape
    ImDrawList* display_draw_list = window->DrawList;
    const ImU32 tab_col = GetColorU32((held || hovered) ? ImGuiCol_TabHovered : tab_contents_visible ? (tab_bar_focused ? ImGuiCol_TabActive : ImGuiCol_TabUnfocusedActive) : (tab_bar_focused ? ImGuiCol_Tab : ImGuiCol_TabUnfocused));
    TabItemBackground(display_draw_list, bb, flags, tab_col);
    RenderNavHighlight(bb, id);

    // Select with right mouse button. This is so the common idiom for context menu automatically highlight the current widget.
    const bool hovered_unblocked = IsItemHovered(ImGuiHoveredFlags_AllowWhenBlockedByPopup);
    if (hovered_unblocked && (IsMouseClicked(1) || IsMouseReleased(1)))
        if (!is_tab_button)
            tab_bar->NextSelectedTabId = id;

    if (tab_bar->Flags & ImGuiTabBarFlags_NoCloseWithMiddleMouseButton)
        flags |= ImGuiTabItemFlags_NoCloseWithMiddleMouseButton;

    // Render tab label, process close button
    const ImGuiID close_button_id = p_open ? GetIDWithSeed("#CLOSE", NULL, id) : 0;
    bool just_closed;
    bool text_clipped;
    TabItemLabelAndCloseButton(display_draw_list, bb, flags, tab_bar->FramePadding, label, id, close_button_id, tab_contents_visible, &just_closed, &text_clipped);
    if (just_closed && p_open != NULL)
    {
        *p_open = false;
        TabBarCloseTab(tab_bar, tab);
    }

    // Restore main window position so user can draw there
    if (want_clip_rect)
        PopClipRect();
    window->DC.CursorPos = backup_main_cursor_pos;

    // Tooltip (FIXME: Won't work over the close button because ItemOverlap systems messes up with HoveredIdTimer)
    // We test IsItemHovered() to discard e.g. when another item is active or drag and drop over the tab bar (which g.HoveredId ignores)
    if (text_clipped && g.HoveredId == id && !held && g.HoveredIdNotActiveTimer > g.TooltipSlowDelay && IsItemHovered())
        if (!(tab_bar->Flags & ImGuiTabBarFlags_NoTooltip) && !(tab->Flags & ImGuiTabItemFlags_NoTooltip))
            SetTooltip("%.*s", (int)(FindRenderedTextEnd(label) - label), label);

    IM_ASSERT(!is_tab_button || !(tab_bar->SelectedTabId == tab->ID && is_tab_button)); // TabItemButton should not be selected
    if (is_tab_button)
        return pressed;
    return tab_contents_visible;
}